

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool ICM::Parser::createAST(Match *match,AST *ast,ElementPool *EP)

{
  uint uVar1;
  MatchType type;
  bool bVar2;
  long lVar3;
  char *__format;
  bool bVar4;
  long lVar5;
  Element EVar6;
  MatchResult mr;
  MatchResult local_88;
  char ***local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  ElementPool *local_48;
  anon_union_4_2_4727c1b0_for_Element_0 local_40 [2];
  uint_t local_38;
  
  local_48 = EP;
  Match::matchNext((MatchResult *)&local_68,match);
  do {
    switch((ulong)local_68 & 0xffffffff) {
    case 0:
    case 2:
      if (CONCAT44(uStack_5c,uStack_60) == CONCAT44(uStack_54,uStack_58)) {
        return false;
      }
      Match::matchNext(&local_88,match);
      local_68 = (char ***)local_88._0_8_;
      uStack_58 = local_88.endPtr._0_4_;
      uStack_54 = local_88.endPtr._4_4_;
      uStack_60 = local_88.beginPtr._0_4_;
      uStack_5c = local_88.beginPtr._4_4_;
      break;
    default:
      goto switchD_0012f020_caseD_1;
    case 3:
    case 5:
      lVar3 = CONCAT44(uStack_5c,uStack_60);
      lVar5 = CONCAT44(uStack_54,uStack_58);
      if (lVar3 == lVar5) goto LAB_0012f1f7;
      bVar4 = false;
      bVar2 = false;
      goto LAB_0012f07b;
    }
  } while( true );
switchD_0012f020_caseD_1:
  uVar1 = match->linenum;
  __format = "Syntax Error in line(%d).\n";
  goto LAB_0012f22b;
  while( true ) {
    Match::matchNext(&local_88,match);
    local_68 = (char ***)local_88._0_8_;
    uStack_60 = local_88.beginPtr._0_4_;
    uStack_5c = local_88.beginPtr._4_4_;
    lVar3 = CONCAT44(local_88.beginPtr._4_4_,local_88.beginPtr._0_4_);
    lVar5 = CONCAT44(local_88.endPtr._4_4_,local_88.endPtr._0_4_);
    if (lVar3 == lVar5) break;
LAB_0012f07b:
    local_88._0_8_ = &local_88.endPtr;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,lVar3,lVar5);
    if ((char **)local_88._0_8_ != &local_88.endPtr) {
      operator_delete((void *)local_88._0_8_,
                      CONCAT44(local_88.endPtr._4_4_,local_88.endPtr._0_4_) + 1);
    }
    type = (MatchType)local_68;
    switch((MatchType)local_68) {
    case MT_LBracket:
      AST::pushNode(ast);
      bVar2 = true;
      goto LAB_0012f19b;
    case MT_RBracket:
      if (bVar2) {
        local_88.type = match->linenum;
        printf("%s","Unfind Method in Line(");
        println<unsigned_int,char[3]>(&local_88.type,(char (*) [3])").");
        return false;
      }
      AST::retNode(ast);
      goto LAB_0012f18d;
    case MT_LSBracket:
      AST::pushNode(ast);
      local_88.type = 0x1904;
      local_88.beginPtr._0_4_ = 0;
      local_88.beginPtr._4_4_ = 0;
      AST::pushData(ast,(Element *)&local_88);
      bVar2 = false;
      goto LAB_0012f19b;
    case MT_RSBracket:
      AST::retNode(ast);
      break;
    default:
      break;
    case MT_Identifier:
    case MT_Keyword:
    case MT_Boolean:
    case MT_Number:
    case MT_String:
      local_88._0_8_ = &local_88.endPtr;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,lVar3,lVar5);
      EVar6 = createElementData(type,(string *)&local_88,local_48);
      local_38 = EVar6.index;
      local_40[0] = EVar6.field_0;
      AST::pushData(ast,(Element *)&local_40[0].field_0);
      if ((char **)local_88._0_8_ != &local_88.endPtr) {
        operator_delete((void *)local_88._0_8_,
                        CONCAT44(local_88.endPtr._4_4_,local_88.endPtr._0_4_) + 1);
      }
LAB_0012f18d:
      bVar2 = false;
    }
    if (bVar4) {
LAB_0012f19b:
      bVar4 = true;
      if ((ast->farthptrs).c.
          super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (ast->farthptrs).c.
          super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) break;
    }
    else {
      bVar4 = false;
    }
  }
LAB_0012f1f7:
  if ((long)(ast->Table).
            super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(ast->Table).
            super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    return false;
  }
  if ((ast->farthptrs).c.
      super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (ast->farthptrs).c.
      super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    return true;
  }
  uVar1 = match->linenum;
  __format = "Error match \')\' in line(%d).\n";
LAB_0012f22b:
  printf(__format,(ulong)uVar1);
  return false;
}

Assistant:

bool createAST(Match &match, AST &ast, Compiler::ElementPool &EP)
		{
			MatchResult mr = match.matchNext();

			// Check Unmatch
			while (mr.getType() == MT_Null || mr.getType() == MT_Comment) {
				if (mr.begin() != mr.end())
					mr = match.matchNext();
				else
					return false;
			}
			if (mr.getType() != MT_LBracket && mr.getType() != MT_LSBracket) {
				printf("Syntax Error in line(%d).\n", match.getCurLineNum());
				return false;
			}

			// Start Match
			bool firstMatchBraket = false;
			bool emptybreak = false;

			while (mr.begin() != mr.end()) {

				if (mr.getString()[0] != '\n') {
					//println(mr);
				}

				switch (mr.getType()) {
				case MT_LBracket:
					ast.pushNode();
					firstMatchBraket = true;
					emptybreak = true;
					break;
				case MT_RBracket:
					if (firstMatchBraket) {
						println("Unfind Method in Line(", match.getCurLineNum(), ").");
						return false;
					}
					ast.retNode();
					break;
				case MT_LSBracket:
					ast.pushNode();
					ast.pushData(AST::Element::Keyword(Keyword::list_));
					firstMatchBraket = false;
					emptybreak = true;
					break;
				case MT_RSBracket:
					ast.retNode();
					break;
				case MT_Identifier: case MT_Keyword:
				case MT_Number: case MT_String: case MT_Boolean:
					//if (firstMatchBraket) {
					//	printf("Error '%s' is not function in line(%d).\n", mr.getString().c_str(), match.getCurLineNum());
					//	return false;
					//}
					ast.pushData(createElementData(mr.getType(), mr.getString(), EP));
					firstMatchBraket = false;
					break;
				default:
					break;
				}

				if (emptybreak && ast.isend()) {
					break;
				}
				mr = match.matchNext();
			}

			if (ast.empty())
				return false;

			if (!ast.isend()) {
				printf("Error match ')' in line(%d).\n", match.getCurLineNum());
				return false;
			}
			return true;
		}